

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O3

int Abc_NodeRefDeref(Abc_Obj_t *pNode,int fReference,int fLabel)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  int *piVar4;
  void **ppvVar5;
  Abc_Obj_t *pNode_00;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong extraout_RDX;
  int iVar9;
  bool bVar10;
  
  uVar8 = (ulong)(uint)fLabel;
  iVar1 = 0;
  while( true ) {
    bVar10 = fReference == 0;
    iVar9 = 0;
    while( true ) {
      if (fLabel != 0) {
        pAVar3 = pNode->pNtk;
        iVar6 = pNode->Id;
        iVar2 = pAVar3->nTravIds;
        Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,(int)uVar8);
        if (((long)iVar6 < 0) || ((pAVar3->vTravIds).nSize <= iVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (pAVar3->vTravIds).pArray[iVar6] = iVar2;
      }
      uVar7 = *(uint *)&pNode->field_0x14 & 0xf;
      iVar6 = 0;
      if ((uVar7 == 2) || (uVar7 == 5)) goto LAB_00828aba;
      piVar4 = (pNode->vFanins).pArray;
      uVar8 = (ulong)*piVar4;
      ppvVar5 = pNode->pNtk->vObjs->pArray;
      pNode_00 = (Abc_Obj_t *)ppvVar5[uVar8];
      pNode = (Abc_Obj_t *)ppvVar5[piVar4[1]];
      iVar2 = (pNode_00->vFanouts).nSize;
      if (bVar10) break;
      (pNode_00->vFanouts).nSize = iVar2 + 1;
      iVar6 = 1;
      if (iVar2 == 0) {
        iVar6 = Abc_NodeRefDeref(pNode_00,1,fLabel);
        iVar6 = iVar6 + 1;
      }
      iVar2 = (pNode->vFanouts).nSize;
      uVar7 = iVar2 + 1;
      uVar8 = (ulong)uVar7;
      (pNode->vFanouts).nSize = uVar7;
      if (iVar2 != 0) goto LAB_00828aba;
      iVar9 = iVar9 + iVar6;
      bVar10 = false;
    }
    if (iVar2 < 1) {
      __assert_fail("pNode0->vFanouts.nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcRefs.c"
                    ,0x95,"int Abc_NodeRefDeref(Abc_Obj_t *, int, int)");
    }
    if ((pNode->vFanouts).nSize < 1) {
      __assert_fail("pNode1->vFanouts.nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcRefs.c"
                    ,0x96,"int Abc_NodeRefDeref(Abc_Obj_t *, int, int)");
    }
    iVar6 = 1;
    (pNode_00->vFanouts).nSize = iVar2 + -1;
    if (iVar2 + -1 == 0) {
      iVar6 = Abc_NodeRefDeref(pNode_00,0,fLabel);
      iVar6 = iVar6 + 1;
      uVar8 = extraout_RDX;
    }
    piVar4 = &(pNode->vFanouts).nSize;
    *piVar4 = *piVar4 + -1;
    if (*piVar4 != 0) break;
    iVar1 = iVar1 + iVar6 + iVar9;
    fReference = 0;
  }
LAB_00828aba:
  return iVar9 + iVar1 + iVar6;
}

Assistant:

int Abc_NodeRefDeref( Abc_Obj_t * pNode, int fReference, int fLabel )
{
    Abc_Obj_t * pNode0, * pNode1;
    int Counter;
    // label visited nodes
    if ( fLabel )
        Abc_NodeSetTravIdCurrent( pNode );
    // skip the CI
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    // process the internal node
    pNode0 = Abc_ObjFanin0(pNode);
    pNode1 = Abc_ObjFanin1(pNode);
    Counter = 1;
    if ( fReference )
    {
        if ( pNode0->vFanouts.nSize++ == 0 )
            Counter += Abc_NodeRefDeref( pNode0, fReference, fLabel );
        if ( pNode1->vFanouts.nSize++ == 0 )
            Counter += Abc_NodeRefDeref( pNode1, fReference, fLabel );
    }
    else
    {
        assert( pNode0->vFanouts.nSize > 0 );
        assert( pNode1->vFanouts.nSize > 0 );
        if ( --pNode0->vFanouts.nSize == 0 )
            Counter += Abc_NodeRefDeref( pNode0, fReference, fLabel );
        if ( --pNode1->vFanouts.nSize == 0 )
            Counter += Abc_NodeRefDeref( pNode1, fReference, fLabel );
    }
    return Counter;
}